

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::IsIntArrayType(ValidationState_t *this,uint32_t id)

{
  uint32_t id_00;
  Instruction *pIVar1;
  
  pIVar1 = FindDef(this,id);
  if ((pIVar1 != (Instruction *)0x0) && ((pIVar1->inst_).opcode == 0x1c)) {
    id_00 = GetComponentType(this,id);
    pIVar1 = FindDef(this,id_00);
    if (pIVar1 != (Instruction *)0x0) {
      return (pIVar1->inst_).opcode == 0x15;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsIntArrayType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeArray) {
    return IsIntScalarType(GetComponentType(id));
  }

  return false;
}